

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,nk_bool *selected,char *hash,int len,int line)

{
  int *piVar1;
  nk_command_buffer *b;
  nk_vec2 nVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *pnVar6;
  nk_hash name;
  nk_widget_layout_states nVar7;
  nk_bool nVar8;
  int iVar9;
  nk_uint *pnVar10;
  long lVar11;
  nk_table *pnVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  nk_panel *layout;
  long lVar16;
  nk_context *in;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_window *win;
  nk_flags local_bc;
  nk_rect local_b8;
  float local_a8;
  float local_a4;
  float local_a0;
  nk_flags ws;
  nk_rect local_98;
  nk_style_selectable *local_88;
  nk_bool *local_80;
  nk_panel *local_78;
  undefined8 uStack_70;
  nk_image *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_b8.x = (float)type;
  pnVar3 = ctx->current;
  if (hash == (char *)0x0) {
    lVar14 = 0;
    if ((title != (char *)0x0) && (*title != '\0')) {
      lVar14 = 0;
      do {
        lVar15 = lVar14 + 1;
        lVar14 = lVar14 + 1;
      } while (title[lVar15] != '\0');
    }
    len = (int)lVar14;
    hash = title;
  }
  local_60 = img;
  name = nk_murmur_hash(hash,len,line);
  pnVar12 = pnVar3->tables;
  do {
    if (pnVar12 == (nk_table *)0x0) {
      pnVar10 = nk_add_value(ctx,pnVar3,name,0);
      *pnVar10 = initial_state;
LAB_0011e181:
      lVar14 = 0;
      if ((title != (char *)0x0) && (lVar14 = 0, *title != '\0')) {
        lVar14 = 0;
        do {
          lVar15 = lVar14 + 1;
          lVar14 = lVar14 + 1;
        } while (title[lVar15] != '\0');
      }
      local_98.x = 0.0;
      local_98.y = 0.0;
      local_98.w = 0.0;
      local_98.h = 0.0;
      ws = 0;
      iVar9 = 0;
      if (((ctx != (nk_context *)0x0) &&
          (pnVar3 = ctx->current, iVar9 = 0, pnVar3 != (nk_window *)0x0)) &&
         (pnVar4 = pnVar3->layout, pnVar4 != (nk_panel *)0x0)) {
        local_a8 = (ctx->style).window.spacing.x;
        local_a4 = (ctx->style).window.spacing.y;
        local_a0 = (ctx->style).selectable.padding.x;
        fVar17 = (ctx->style).tab.padding.y;
        fVar17 = fVar17 + fVar17 + ((ctx->style).font)->height;
        (pnVar4->row).min_height = fVar17;
        local_80 = selected;
        nk_row_layout(ctx,NK_DYNAMIC,fVar17,1,0);
        if ((ctx->current != (nk_window *)0x0) &&
           (pnVar5 = ctx->current->layout, pnVar5 != (nk_panel *)0x0)) {
          fVar17 = (ctx->style).text.padding.y;
          fVar18 = (ctx->style).window.min_row_height_padding;
          (pnVar5->row).min_height = fVar18 + fVar18 + fVar17 + fVar17 + ((ctx->style).font)->height
          ;
        }
        b = &pnVar3->buffer;
        nVar7 = nk_widget(&local_98,ctx);
        if (local_b8.x == 1.4013e-45) {
          local_b8.x = local_98.x;
          local_b8.y = local_98.y;
          local_b8.w = 0.0;
          local_b8.h = 0.0;
          if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
            r.w = local_98.w;
            r.h = local_98.h;
            r.x = local_98.x;
            r.y = local_98.y;
            nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
          }
          else {
            local_78 = (nk_panel *)local_98._8_8_;
            uStack_70 = 0;
            rect.w = local_98.w;
            rect.h = local_98.h;
            rect.x = local_98.x;
            rect.y = local_98.y;
            nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
            fVar17 = (ctx->style).tab.border;
            rect_00.x = fVar17 + local_b8.x;
            rect_00.y = fVar17 + local_b8.y;
            fVar17 = fVar17 + fVar17;
            auVar19._4_4_ = fVar17;
            auVar19._0_4_ = fVar17;
            auVar19._8_4_ = fVar17;
            auVar19._12_4_ = fVar17;
            auVar20._8_8_ = uStack_70;
            auVar20._0_8_ = local_78;
            auVar20 = maxps(auVar19,auVar20);
            rect_00.w = auVar20._0_4_ - fVar17;
            rect_00.h = auVar20._4_4_ - fVar17;
            nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color)
            ;
          }
          lVar11 = 0x17c8;
          lVar15 = 0x1878;
        }
        else {
          lVar11 = 0x1928;
          lVar15 = 0x19d8;
          local_b8.w = 0.0;
          local_b8.h = 0.0;
          local_b8.x = local_98.x;
          local_b8.y = local_98.y;
        }
        lVar16 = 0;
        in = (nk_context *)0x0;
        if (nVar7 == NK_WIDGET_VALID && (pnVar4->flags & 0x1000) == 0) {
          in = ctx;
        }
        if (*pnVar10 == 1) {
          lVar15 = lVar11;
        }
        pnVar6 = (ctx->style).font;
        fVar17 = pnVar6->height;
        nVar2 = (ctx->style).tab.padding;
        bounds.x = nVar2.x + local_b8.x;
        bounds.y = nVar2.y + local_b8.y;
        fStack_40 = local_b8.w + 0.0;
        fStack_3c = local_b8.h + 0.0;
        local_58 = ZEXT416((uint)fVar17);
        bounds.h = fVar17;
        bounds.w = fVar17;
        local_78 = pnVar4;
        local_48 = bounds.x;
        fStack_44 = bounds.y;
        nVar8 = nk_do_button_symbol(&ws,b,bounds,(&(ctx->style).tab.sym_minimize)[*pnVar10 == 1],
                                    NK_BUTTON_DEFAULT,
                                    (nk_style_button *)
                                    ((long)&(ctx->input).keyboard.keys[0].down + lVar15),&in->input,
                                    pnVar6);
        if (nVar8 != 0) {
          *pnVar10 = (uint)(*pnVar10 != 1);
        }
        local_bc = 0;
        if ((title != (char *)0x0) && (*title != '\0')) {
          lVar16 = 0;
          do {
            lVar15 = lVar16 + 1;
            lVar16 = lVar16 + 1;
          } while (title[lVar15] != '\0');
        }
        local_88 = &(ctx->style).selectable;
        pnVar6 = (ctx->style).font;
        fVar18 = (*pnVar6->width)(pnVar6->userdata,pnVar6->height,title,(int)lVar16);
        fVar18 = local_a0 * 4.0 + fVar18;
        fVar17 = local_a8 + (float)local_58._0_4_;
        if (local_a8 + (float)local_58._0_4_ <= local_98.w) {
          fVar17 = local_98.w;
        }
        fVar21 = (float)local_58._0_4_ + local_48 + local_a8;
        fVar17 = fVar17 - (local_a4 + (float)local_58._0_4_ + (ctx->style).tab.indent);
        if (fVar18 <= fVar17) {
          fVar17 = fVar18;
        }
        pnVar6 = (ctx->style).font;
        if (local_60 == (nk_image *)0x0) {
          bounds_00.y = fStack_44;
          bounds_00.x = fVar21;
          bounds_00.w = fVar17;
          bounds_00.h = pnVar6->height;
          nk_do_selectable(&local_bc,b,bounds_00,title,(int)lVar14,0x11,local_80,local_88,&in->input
                           ,pnVar6);
        }
        else {
          nk_do_selectable_image
                    (&local_bc,b,
                     (nk_rect)CONCAT88(CONCAT44(pnVar6->height,fVar17),CONCAT44(fStack_44,fVar21)),
                     title,(int)lVar14,0x11,local_80,local_60,local_88,&in->input,pnVar6);
        }
        iVar9 = 0;
        if (*pnVar10 == 1) {
          fVar17 = (ctx->style).tab.indent;
          local_78->at_x = local_b8.x + (float)*local_78->offset_x + fVar17;
          fVar18 = (local_78->bounds).w;
          fVar21 = fVar17;
          if (fVar17 <= fVar18) {
            fVar21 = fVar18;
          }
          (local_78->bounds).w = fVar21 - (fVar17 + (ctx->style).window.padding.x);
          piVar1 = &(local_78->row).tree_depth;
          *piVar1 = *piVar1 + 1;
          iVar9 = 1;
        }
      }
      return iVar9;
    }
    uVar13 = (ulong)pnVar12->size;
    if (uVar13 != 0) {
      pnVar10 = pnVar12->values;
      do {
        if (pnVar10[-0x3b] == name) {
          pnVar12->seq = pnVar3->seq;
          goto LAB_0011e181;
        }
        pnVar10 = pnVar10 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    pnVar12 = pnVar12->next;
  } while( true );
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
nk_bool *selected, const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
} return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
nk_strlen(title), (enum nk_collapse_states*)state, selected);
}